

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

bool __thiscall
kj::_::NetworkFilter::shouldAllowParse(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  CidrRange *pCVar4;
  NetworkFilter *this_00;
  NetworkFilter *n;
  NetworkFilter *_n3210;
  CidrRange *cidr;
  CidrRange *__end3;
  CidrRange *__begin3;
  Vector<kj::CidrRange> *__range3;
  ArrayPtr<const_char> path;
  bool matched;
  uint addrlen_local;
  sockaddr *addr_local;
  NetworkFilter *this_local;
  
  path.size_._3_1_ = 0;
  path.size_._4_4_ = addrlen;
  if (addr->sa_family == 1) {
    ___range3 = safeUnixPath((sockaddr_un *)addr,addrlen);
    sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&__range3);
    if ((sVar2 == 0) ||
       (pcVar3 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&__range3,0),
       *pcVar3 != '\0')) {
      if ((this->allowUnix & 1U) != 0) {
        path.size_._3_1_ = 1;
      }
    }
    else if ((this->allowAbstractUnix & 1U) != 0) {
      path.size_._3_1_ = 1;
    }
  }
  else {
    if (((addr->sa_family == 2) || (addr->sa_family == 10)) &&
       (((this->allowPublic & 1U) != 0 || ((this->allowNetwork & 1U) != 0)))) {
      path.size_._3_1_ = 1;
    }
    __end3 = Vector<kj::CidrRange>::begin(&this->allowCidrs);
    pCVar4 = Vector<kj::CidrRange>::end(&this->allowCidrs);
    for (; __end3 != pCVar4; __end3 = __end3 + 1) {
      bVar1 = CidrRange::matchesFamily(__end3,(uint)addr->sa_family);
      if (bVar1) {
        path.size_._3_1_ = 1;
      }
    }
  }
  if ((path.size_._3_1_ & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = readMaybe<kj::_::NetworkFilter>(&this->next);
    if (this_00 == (NetworkFilter *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = shouldAllowParse(this_00,addr,path.size_._4_4_);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool NetworkFilter::shouldAllowParse(const struct sockaddr* addr, uint addrlen) {
  bool matched = false;
#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      if (allowAbstractUnix) matched = true;
    } else {
      if (allowUnix) matched = true;
    }
  } else {
#endif
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        (allowPublic || allowNetwork)) {
      matched = true;
    }
    for (auto& cidr: allowCidrs) {
      if (cidr.matchesFamily(addr->sa_family)) {
        matched = true;
      }
    }
#if !_WIN32
  }
#endif

  if (matched) {
    KJ_IF_SOME(n, next) {
      return n.shouldAllowParse(addr, addrlen);
    } else {
      return true;
    }
  } else {
    // No allow rule matches this address family, so don't even allow parsing it.
    return false;
  }
}

}